

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChFunctionPosition_line::Get_p
          (ChVector<double> *__return_storage_ptr__,ChFunctionPosition_line *this,double s)

{
  element_type *peVar1;
  
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  peVar1 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar1,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionPosition_line::Get_p(double s) const {
	ChVector<> p;
	double u = space_fx->Get_y(s);
    trajectory_line->Evaluate(p, u);
	return p;
}